

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_read_radix(mp_int *a,char *str,int radix)

{
  char cVar1;
  int iVar2;
  int iVar3;
  __int32_t **pp_Var4;
  char cVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  
  a->sign = 0;
  a->used = 0;
  iVar2 = a->alloc;
  lVar8 = (long)iVar2;
  if (0 < lVar8) {
    memset(a->dp,0,lVar8 * 8);
  }
  iVar3 = -3;
  if (0xffffffc0 < radix - 0x41U) {
    cVar1 = *str;
    pcVar6 = str + (cVar1 == '-');
    a->sign = 0;
    a->used = 0;
    if (0 < iVar2) {
      memset(a->dp,0,lVar8 << 3);
    }
    cVar5 = *pcVar6;
    if (cVar5 != '\0') {
      do {
        if (radix < 0x24) {
          pp_Var4 = __ctype_toupper_loc();
          cVar5 = (char)(*pp_Var4)[cVar5];
        }
        uVar7 = 0;
        do {
          if (cVar5 == mp_s_rmap[uVar7]) goto LAB_00108d76;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x40);
        uVar7 = 0x40;
LAB_00108d76:
        if (radix <= (int)uVar7) break;
        iVar2 = mp_mul_d(a,(ulong)(uint)radix,a);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = mp_add_d(a,uVar7 & 0xffffffff,a);
        if (iVar2 != 0) {
          return iVar2;
        }
        cVar5 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
      } while (cVar5 != '\0');
    }
    iVar3 = 0;
    if (a->used != 0) {
      a->sign = (uint)(cVar1 == '-');
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mp_read_radix (mp_int * a, const char *str, int radix)
{
  int     y, res, neg;
  char    ch;

  /* zero the digit bignum */
  mp_zero(a);

  /* make sure the radix is ok */
  if (radix < 2 || radix > 64) {
    return MP_VAL;
  }

  /* if the leading digit is a 
   * minus set the sign to negative. 
   */
  if (*str == '-') {
    ++str;
    neg = MP_NEG;
  } else {
    neg = MP_ZPOS;
  }

  /* set the integer to the default of zero */
  mp_zero (a);
  
  /* process each digit of the string */
  while (*str) {
    /* if the radix < 36 the conversion is case insensitive
     * this allows numbers like 1AB and 1ab to represent the same  value
     * [e.g. in hex]
     */
    ch = (char) ((radix < 36) ? toupper (*str) : *str);
    for (y = 0; y < 64; y++) {
      if (ch == mp_s_rmap[y]) {
         break;
      }
    }

    /* if the char was found in the map 
     * and is less than the given radix add it
     * to the number, otherwise exit the loop. 
     */
    if (y < radix) {
      if ((res = mp_mul_d (a, (mp_digit) radix, a)) != MP_OKAY) {
         return res;
      }
      if ((res = mp_add_d (a, (mp_digit) y, a)) != MP_OKAY) {
         return res;
      }
    } else {
      break;
    }
    ++str;
  }
  
  /* set the sign only if a != 0 */
  if (mp_iszero(a) != 1) {
     a->sign = neg;
  }
  return MP_OKAY;
}